

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O0

void __thiscall OpenMD::DumpWriter::writeFrameProperties(DumpWriter *this,ostream *os,Snapshot *s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  RealType RVar9;
  uint uVar10;
  double *pdVar11;
  element_type *peVar12;
  Snapshot *in_RDX;
  ostream *in_RSI;
  shared_ptr<OpenMD::SPFData> spfData;
  uint j_1;
  uint i_1;
  Mat3x3d eta;
  pair<double,_double> thermostat;
  uint j;
  uint i;
  Mat3x3d hmat;
  RealType currentTime;
  char buffer [1024];
  Snapshot *in_stack_fffffffffffff828;
  Snapshot *pSVar13;
  SquareMatrix3<double> *in_stack_fffffffffffff830;
  uint local_570;
  uint local_56c;
  RectMatrix<double,_3U,_3U> local_520;
  pair<double,_double> local_4d8;
  uint local_4c4;
  uint local_4c0;
  RectMatrix<double,_3U,_3U> local_468;
  double local_420;
  char local_418 [1024];
  Snapshot *local_18;
  ostream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::operator<<(in_RSI,"    <FrameData>\n");
  local_420 = Snapshot::getTime(local_18);
  uVar10 = std::isinf(local_420);
  if (((uVar10 & 1) != 0) || (uVar10 = std::isnan(local_420), (uVar10 & 1) != 0)) {
    snprintf(painCave.errMsg,2000,"DumpWriter detected a numerical error writing the time");
    painCave.isFatal = 1;
    simError();
  }
  snprintf(local_418,0x400,"        Time: %.10g\n",local_420);
  std::operator<<(local_10,local_418);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1625dd);
  Snapshot::getHmat(in_stack_fffffffffffff828);
  SquareMatrix3<double>::operator=
            (in_stack_fffffffffffff830,(SquareMatrix3<double> *)in_stack_fffffffffffff828);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x162618);
  for (local_4c0 = 0; local_4c0 < 3; local_4c0 = local_4c0 + 1) {
    for (local_4c4 = 0; local_4c4 < 3; local_4c4 = local_4c4 + 1) {
      pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,local_4c0,local_4c4);
      uVar10 = std::isinf(*pdVar11);
      if ((uVar10 & 1) == 0) {
        pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,local_4c0,local_4c4);
        uVar10 = std::isnan(*pdVar11);
        if ((uVar10 & 1) != 0) goto LAB_001626e2;
      }
      else {
LAB_001626e2:
        snprintf(painCave.errMsg,2000,"DumpWriter detected a numerical error writing the box");
        painCave.isFatal = 1;
        simError();
      }
    }
  }
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,0);
  dVar1 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,0);
  dVar2 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,0);
  dVar3 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,1);
  dVar4 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,1);
  dVar5 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,1);
  dVar6 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,2);
  dVar7 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,2);
  dVar8 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,2);
  pSVar13 = (Snapshot *)*pdVar11;
  snprintf(local_418,0x400,
           "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
  std::operator<<(local_10,local_418);
  local_4d8 = Snapshot::getThermostat(local_18);
  uVar10 = std::isinf(local_4d8.first);
  if ((uVar10 & 1) == 0) {
    uVar10 = std::isnan(local_4d8.first);
    if ((uVar10 & 1) != 0) goto LAB_00162abb;
    uVar10 = std::isinf(local_4d8.second);
    if ((uVar10 & 1) != 0) goto LAB_00162abb;
    uVar10 = std::isnan(local_4d8.second);
    if ((uVar10 & 1) != 0) goto LAB_00162abb;
  }
  else {
LAB_00162abb:
    snprintf(painCave.errMsg,2000,"DumpWriter detected a numerical error writing the thermostat");
    painCave.isFatal = 1;
    simError();
  }
  snprintf(local_418,0x400,"  Thermostat: %.10g , %.10g\n",local_4d8.first,local_4d8.second);
  std::operator<<(local_10,local_418);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x162b51);
  Snapshot::getBarostat(pSVar13);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffff830,(SquareMatrix3<double> *)pSVar13);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x162b8e);
  for (local_56c = 0; local_56c < 3; local_56c = local_56c + 1) {
    for (local_570 = 0; local_570 < 3; local_570 = local_570 + 1) {
      pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,local_56c,local_570);
      uVar10 = std::isinf(*pdVar11);
      if ((uVar10 & 1) == 0) {
        pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,local_56c,local_570);
        uVar10 = std::isnan(*pdVar11);
        if ((uVar10 & 1) != 0) goto LAB_00162c58;
      }
      else {
LAB_00162c58:
        snprintf(painCave.errMsg,2000,"DumpWriter detected a numerical error writing the barostat");
        painCave.isFatal = 1;
        simError();
      }
    }
  }
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,0,0);
  dVar1 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,1,0);
  dVar2 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,2,0);
  dVar3 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,0,1);
  dVar4 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,1,1);
  dVar5 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,2,1);
  dVar6 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,0,2);
  dVar7 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,1,2);
  dVar8 = *pdVar11;
  pdVar11 = RectMatrix<double,_3U,_3U>::operator()(&local_520,2,2);
  pSVar13 = (Snapshot *)*pdVar11;
  snprintf(local_418,0x400,
           "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
  std::operator<<(local_10,local_418);
  Snapshot::getSPFData(pSVar13);
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x162f80);
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,0);
  uVar10 = std::isinf(*pdVar11);
  if ((uVar10 & 1) == 0) {
    peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x162fcc);
    pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,0);
    uVar10 = std::isnan(*pdVar11);
    if ((uVar10 & 1) == 0) {
      peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x163018);
      pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,1);
      uVar10 = std::isinf(*pdVar11);
      if ((uVar10 & 1) == 0) {
        peVar12 = std::
                  __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x163067);
        pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,1);
        uVar10 = std::isnan(*pdVar11);
        if ((uVar10 & 1) == 0) {
          peVar12 = std::
                    __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1630b0);
          pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,2);
          uVar10 = std::isinf(*pdVar11);
          if ((uVar10 & 1) == 0) {
            peVar12 = std::
                      __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1630f3);
            pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,2);
            uVar10 = std::isnan(*pdVar11);
            if ((uVar10 & 1) == 0) {
              peVar12 = std::
                        __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x163132);
              uVar10 = std::isinf(peVar12->lambda);
              if ((uVar10 & 1) == 0) {
                peVar12 = std::
                          __shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x163159);
                uVar10 = std::isnan(peVar12->lambda);
                if ((uVar10 & 1) == 0) goto LAB_001631d0;
              }
            }
          }
        }
      }
    }
  }
  snprintf(painCave.errMsg,2000,
           "DumpWriter detected a numerical error writing the spf data structure");
  painCave.isFatal = 1;
  simError();
LAB_001631d0:
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1631ea);
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,0);
  dVar1 = *pdVar11;
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x163217);
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,1);
  dVar2 = *pdVar11;
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x163247);
  pdVar11 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)peVar12,2);
  dVar3 = *pdVar11;
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16327c);
  RVar9 = peVar12->lambda;
  peVar12 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x163291);
  snprintf(local_418,0x400,"     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",dVar1,dVar2,dVar3
           ,RVar9,(ulong)(uint)peVar12->globalID);
  std::operator<<(local_10,local_418);
  std::operator<<(local_10,"    </FrameData>\n");
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x1632fe);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16330b);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x163318);
  return;
}

Assistant:

void DumpWriter::writeFrameProperties(std::ostream& os, Snapshot* s) {
    char buffer[1024];

    os << "    <FrameData>\n";

    RealType currentTime = s->getTime();

    if (std::isinf(currentTime) || std::isnan(currentTime)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the time");
      painCave.isFatal = 1;
      simError();
    }

    snprintf(buffer, 1024, "        Time: %.10g\n", currentTime);
    os << buffer;

    Mat3x3d hmat;
    hmat = s->getHmat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(hmat(i, j)) || std::isnan(hmat(i, j))) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the box");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        hmat(0, 0), hmat(1, 0), hmat(2, 0), hmat(0, 1), hmat(1, 1), hmat(2, 1),
        hmat(0, 2), hmat(1, 2), hmat(2, 2));
    os << buffer;

    pair<RealType, RealType> thermostat = s->getThermostat();

    if (std::isinf(thermostat.first) || std::isnan(thermostat.first) ||
        std::isinf(thermostat.second) || std::isnan(thermostat.second)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the thermostat");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024, "  Thermostat: %.10g , %.10g\n", thermostat.first,
             thermostat.second);
    os << buffer;

    Mat3x3d eta;
    eta = s->getBarostat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(eta(i, j)) || std::isnan(eta(i, j))) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "DumpWriter detected a numerical error writing the barostat");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        eta(0, 0), eta(1, 0), eta(2, 0), eta(0, 1), eta(1, 1), eta(2, 1),
        eta(0, 2), eta(1, 2), eta(2, 2));
    os << buffer;

    // SPF Data
    std::shared_ptr<SPFData> spfData = s->getSPFData();

    if (std::isinf(spfData->pos[0]) || std::isnan(spfData->pos[0]) ||
        std::isinf(spfData->pos[1]) || std::isnan(spfData->pos[1]) ||
        std::isinf(spfData->pos[2]) || std::isnan(spfData->pos[2]) ||
        std::isinf(spfData->lambda) || std::isnan(spfData->lambda)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the spf data "
               "structure");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024,
             "     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",
             spfData->pos[0], spfData->pos[1], spfData->pos[2], spfData->lambda,
             spfData->globalID);
    os << buffer;

    os << "    </FrameData>\n";
  }